

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

int ChickenHook::vaListToString(char *CFormatString,__va_list_tag *argptr,string *result)

{
  char *pcVar1;
  allocator local_59;
  string local_58 [32];
  char *local_38;
  char *buffer;
  string *psStack_28;
  int len;
  string *result_local;
  __va_list_tag *argptr_local;
  char *CFormatString_local;
  
  psStack_28 = result;
  result_local = (string *)argptr;
  argptr_local = (__va_list_tag *)CFormatString;
  buffer._4_4_ = _vscprintf(CFormatString,argptr);
  CFormatString_local._4_4_ = buffer._4_4_;
  if (-1 < buffer._4_4_) {
    local_38 = (char *)operator_new__((long)(buffer._4_4_ + 1));
    buffer._4_4_ = vsnprintf(local_38,(long)(buffer._4_4_ + 1),(char *)argptr_local,result_local);
    pcVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar1,&local_59);
    std::__cxx11::string::operator=((string *)psStack_28,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    if (local_38 != (char *)0x0) {
      operator_delete__(local_38);
    }
    CFormatString_local._4_4_ = buffer._4_4_;
  }
  return CFormatString_local._4_4_;
}

Assistant:

int vaListToString(const char *CFormatString, va_list argptr, std::string &result) {
        // calculate the required buffer length of without actually writing
        int len = _vscprintf(CFormatString, argptr);
        if (len < 0) {
            return len;
        }

        // write into an allocated buffer (add 1 for null termination) and create a string from that result
        char *buffer = new char[len + 1];
        len = vsnprintf(buffer, len + 1, CFormatString, argptr);
        result = std::string(buffer);
        delete[] buffer;
        return len;
    }